

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reporter.cc
# Opt level: O0

void __thiscall
benchmark::JSONReporter::ReportRuns
          (JSONReporter *this,
          vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          *reports)

{
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  reference run;
  __normal_iterator<benchmark::BenchmarkReporter::Run_*,_std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>_>
  *__lhs;
  __normal_iterator<benchmark::BenchmarkReporter::Run_*,_std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>_>
  local_170;
  __normal_iterator<benchmark::BenchmarkReporter::Run_*,_std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>_>
  local_168;
  iterator it_cp;
  __normal_iterator<benchmark::BenchmarkReporter::Run_*,_std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>_>
  local_158;
  iterator it;
  Run stddev_data;
  Run mean_data;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  reports_cp;
  ostream *out;
  allocator local_39;
  string local_38 [8];
  string indent;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  *reports_local;
  JSONReporter *this_local;
  
  indent.field_2._8_8_ = reports;
  bVar1 = std::
          vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          ::empty(reports);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,4,' ',&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    if ((this->first_report_ & 1U) == 0) {
      std::operator<<((ostream *)&std::cout,",\n");
    }
    this->first_report_ = false;
    std::
    vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>::
    vector((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
            *)&mean_data.max_heapbytes_used,
           (vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
            *)indent.field_2._8_8_);
    sVar2 = std::
            vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
            ::size((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                    *)indent.field_2._8_8_);
    if (1 < sVar2) {
      BenchmarkReporter::Run::Run((Run *)&stddev_data.max_heapbytes_used);
      BenchmarkReporter::Run::Run((Run *)&it);
      BenchmarkReporter::ComputeStats
                ((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                  *)indent.field_2._8_8_,(Run *)&stddev_data.max_heapbytes_used,(Run *)&it);
      std::
      vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
      ::push_back((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                   *)&mean_data.max_heapbytes_used,(value_type *)&stddev_data.max_heapbytes_used);
      std::
      vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
      ::push_back((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                   *)&mean_data.max_heapbytes_used,(value_type *)&it);
      BenchmarkReporter::Run::~Run((Run *)&it);
      BenchmarkReporter::Run::~Run((Run *)&stddev_data.max_heapbytes_used);
    }
    local_158._M_current =
         (Run *)std::
                vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                ::begin((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                         *)&mean_data.max_heapbytes_used);
    while( true ) {
      it_cp = std::
              vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
              ::end((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                     *)&mean_data.max_heapbytes_used);
      bVar1 = __gnu_cxx::operator!=(&local_158,&it_cp);
      if (!bVar1) break;
      poVar3 = std::operator<<((ostream *)&std::cout,local_38);
      std::operator<<(poVar3,"{\n");
      run = __gnu_cxx::
            __normal_iterator<benchmark::BenchmarkReporter::Run_*,_std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>_>
            ::operator*(&local_158);
      PrintRunData(this,run);
      poVar3 = std::operator<<((ostream *)&std::cout,local_38);
      std::operator<<(poVar3,'}');
      local_168._M_current = local_158._M_current;
      __lhs = __gnu_cxx::
              __normal_iterator<benchmark::BenchmarkReporter::Run_*,_std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>_>
              ::operator++(&local_168);
      local_170._M_current =
           (Run *)std::
                  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                  ::end((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                         *)&mean_data.max_heapbytes_used);
      bVar1 = __gnu_cxx::operator!=(__lhs,&local_170);
      if (bVar1) {
        std::operator<<((ostream *)&std::cout,",\n");
      }
      __gnu_cxx::
      __normal_iterator<benchmark::BenchmarkReporter::Run_*,_std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>_>
      ::operator++(&local_158);
    }
    std::
    vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>::
    ~vector((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
             *)&mean_data.max_heapbytes_used);
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void JSONReporter::ReportRuns(std::vector<Run> const& reports) {
  if (reports.empty()) {
    return;
  }
  std::string indent(4, ' ');
  std::ostream& out = std::cout;
  if (!first_report_) {
    out << ",\n";
  }
  first_report_ = false;
  std::vector<Run> reports_cp = reports;
  if (reports.size() >= 2) {
    Run mean_data;
    Run stddev_data;
    BenchmarkReporter::ComputeStats(reports, &mean_data, &stddev_data);
    reports_cp.push_back(mean_data);
    reports_cp.push_back(stddev_data);
  }
  for (auto it = reports_cp.begin(); it != reports_cp.end(); ++it) {
     out << indent << "{\n";
     PrintRunData(*it);
     out << indent << '}';
     auto it_cp = it;
     if (++it_cp != reports_cp.end()) {
         out << ",\n";
     }
  }
}